

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O2

string * __thiscall
Diligent::Parsing::GetContext<char_const*>
          (string *__return_storage_ptr__,Parsing *this,char **Start,char **End,char *Pos,
          size_t NumLines)

{
  char cVar1;
  char **End_00;
  long lVar2;
  char *pcVar3;
  byte bVar4;
  size_t LineAbove;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  char *Pos_local;
  char **local_1f0;
  Parsing *local_1e8;
  string msg;
  stringstream Ctx;
  ostream local_1a8 [376];
  
  Pos_local = (char *)End;
  local_1e8 = this;
  if (*(char **)this == *Start) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&Ctx);
  }
  else {
    lVar2 = 0;
    do {
      lVar7 = lVar2;
      pcVar6 = (char *)((long)End + lVar7);
      if ((pcVar6 <= *(char **)this) || (cVar1 = *(char *)((long)End + lVar7 + -1), cVar1 == '\r'))
      break;
      lVar2 = lVar7 + -1;
    } while (cVar1 != '\n');
    local_1f0 = Start;
    Pos_local = SkipLine<char_const*>(&Pos_local,Start,false);
    std::__cxx11::stringstream::stringstream((stringstream *)&Ctx);
    lVar7 = -lVar7;
    pcVar3 = *(char **)local_1e8;
    pcVar5 = (char *)0x0;
    while ((pcVar5 < Pos && (pcVar3 < pcVar6))) {
      bVar4 = pcVar6[-1];
      if ((bVar4 != 10) && (bVar4 != 0xd)) {
        FormatString<char[26],char[24]>
                  (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x70ceb9,
                   (char (*) [24])(ulong)bVar4);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"GetContext",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
                   ,0x212);
        std::__cxx11::string::~string((string *)&msg);
        bVar4 = pcVar6[-1];
        pcVar3 = *(char **)local_1e8;
      }
      if ((pcVar3 + 1 < pcVar6 && bVar4 == 10) && (pcVar6[-2] == 0xd)) {
        pcVar6 = pcVar6 + -1;
      }
      End = (char **)(pcVar6 + -(ulong)(pcVar3 < pcVar6));
      do {
        pcVar6 = (char *)End;
        End = (char **)pcVar6;
        if ((pcVar6 <= pcVar3) || (pcVar6[-1] == 0xd)) break;
        End = (char **)(pcVar6 + -1);
      } while (pcVar6[-1] != 10);
      pcVar5 = pcVar5 + 1;
    }
    if (((pcVar6 != pcVar3) && (pcVar6[-1] != 10)) && (pcVar6[-1] != 0xd)) {
      FormatString<char[26],char[45]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"CtxStart == Start || IsNewLine(CtxStart[-1])",(char (*) [45])End);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetContext",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
                 ,0x21b);
      std::__cxx11::string::~string((string *)&msg);
    }
    std::ostream::write((char *)local_1a8,(long)pcVar6);
    std::endl<char,std::char_traits<char>>(local_1a8);
    while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
      std::operator<<(local_1a8,' ');
    }
    std::operator<<(local_1a8,'^');
    End_00 = local_1f0;
    if (Pos_local != *local_1f0) {
      msg._M_dataplus._M_p = Pos_local;
      while ((bVar8 = Pos != (char *)0x0, Pos = Pos + -1, bVar8 &&
             (pcVar6 = *End_00, msg._M_dataplus._M_p != pcVar6))) {
        if (*msg._M_dataplus._M_p == '\r') {
          pcVar3 = msg._M_dataplus._M_p + 1;
          if ((pcVar3 != pcVar6) && (*pcVar3 == '\n')) {
            msg._M_dataplus._M_p = pcVar3;
          }
        }
        else if (*msg._M_dataplus._M_p == '\0') break;
        if (msg._M_dataplus._M_p != pcVar6) {
          msg._M_dataplus._M_p = msg._M_dataplus._M_p + 1;
        }
        msg._M_dataplus._M_p = SkipLine<char_const*>((char **)&msg,End_00,false);
      }
      std::ostream::write((char *)local_1a8,(long)Pos_local);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&Ctx);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetContext(const IteratorType& Start, const IteratorType& End, IteratorType Pos, size_t NumLines) noexcept
{
    if (Start == End)
        return "";

    auto CtxStart = Pos;
    while (CtxStart > Start && !IsNewLine(CtxStart[-1]))
        --CtxStart;
    const size_t CharPos = Pos - CtxStart; // Position of the character in the line

    Pos = SkipLine(Pos, End);

    std::stringstream Ctx;
    {
        size_t LineAbove = 0;
        while (LineAbove < NumLines && CtxStart > Start)
        {
            VERIFY_EXPR(IsNewLine(CtxStart[-1]));
            if (CtxStart[-1] == '\n' && CtxStart > Start + 1 && CtxStart[-2] == '\r')
                --CtxStart;
            if (CtxStart > Start)
                --CtxStart;
            while (CtxStart > Start && !IsNewLine(CtxStart[-1]))
                --CtxStart;
            ++LineAbove;
        }
        VERIFY_EXPR(CtxStart == Start || IsNewLine(CtxStart[-1]));
        Ctx.write(&*CtxStart, Pos - CtxStart);
    }

    Ctx << std::endl;
    for (size_t i = 0; i < CharPos; ++i)
        Ctx << ' ';
    Ctx << '^';

    if (Pos != End)
    {
        auto   CtxEnd    = Pos;
        size_t LineBelow = 0;
        while (LineBelow < NumLines && CtxEnd != End && *CtxEnd != '\0')
        {
            if (*CtxEnd == '\r' && CtxEnd + 1 != End && CtxEnd[+1] == '\n')
                ++CtxEnd;
            if (CtxEnd != End)
                ++CtxEnd;
            CtxEnd = SkipLine(CtxEnd, End);
            ++LineBelow;
        }
        Ctx.write(&*Pos, CtxEnd - Pos);
    }

    return Ctx.str();
}